

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_parser(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  xmlParserCtxtPtr pxVar23;
  ulong uVar24;
  size_t sVar25;
  xmlDocPtr pxVar26;
  xmlNodePtr pxVar27;
  undefined8 uVar28;
  xmlParserInputBufferPtr pxVar29;
  long lVar30;
  ulong uVar31;
  xmlNodePtr pxVar32;
  long lVar33;
  undefined8 uVar34;
  int nr;
  char *__s;
  undefined8 uVar35;
  int n_options;
  uint uVar36;
  uint *puVar37;
  int *piVar38;
  int n_ctxt;
  uint uVar39;
  uint uVar40;
  ulong in_RSI;
  char *pcVar41;
  int *piVar42;
  undefined *puVar43;
  int n_result;
  undefined8 *puVar44;
  undefined **ppuVar45;
  int *piVar46;
  int test_ret;
  int iVar47;
  undefined4 uVar48;
  int iVar49;
  undefined4 uVar50;
  int test_ret_23;
  uint uVar51;
  undefined4 uVar52;
  ulong uVar53;
  int n_options_2;
  undefined4 *puVar54;
  int *piVar55;
  bool bVar56;
  int test_ret_10;
  int test_ret_9;
  int test_ret_13;
  int test_ret_14;
  int test_ret_19;
  int test_ret_2;
  int test_ret_1;
  int test_ret_24;
  int test_ret_3;
  int test_ret_5;
  int test_ret_4;
  undefined8 in_stack_ffffffffffffff58;
  uint local_94;
  ulong local_90;
  xmlParserInputBufferPtr local_88;
  undefined8 *local_80;
  undefined4 *local_78;
  ulong local_70;
  int local_68;
  int local_64;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined4 *local_40;
  undefined8 *local_38;
  
  if (quiet == '\0') {
    puts("Testing parser : 61 of 70 functions ...");
  }
  uVar39 = 0;
  iVar47 = 0;
  do {
    iVar1 = xmlMemBlocks();
    pxVar23 = gen_xmlParserCtxtPtr(uVar39,(int)in_RSI);
    xmlByteConsumed(pxVar23);
    call_tests = call_tests + 1;
    if (pxVar23 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar23);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlByteConsumed",(ulong)(uint)(iVar2 - iVar1));
      iVar47 = iVar47 + 1;
      in_RSI = (ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar1 = xmlMemBlocks();
  xmlClearNodeInfoSeq(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar2 = xmlMemBlocks();
  if (iVar1 != iVar2) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlClearNodeInfoSeq");
    in_RSI = 0;
    printf(" %d");
    putchar(10);
  }
  local_94 = (uint)(iVar1 != iVar2);
  function_tests = function_tests + 1;
  uVar39 = 0;
  local_64 = 0;
  do {
    iVar1 = xmlMemBlocks();
    pxVar23 = gen_xmlParserCtxtPtr(uVar39,(int)in_RSI);
    xmlClearParserCtxt(pxVar23);
    call_tests = call_tests + 1;
    if (pxVar23 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar23);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlClearParserCtxt",(ulong)(uint)(iVar2 - iVar1));
      local_64 = local_64 + 1;
      in_RSI = (ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  puVar44 = &DAT_00165d70;
  uVar39 = 0;
  local_68 = 0;
  do {
    iVar1 = xmlMemBlocks();
    if (uVar39 < 4) {
      uVar28 = *puVar44;
    }
    else {
      uVar28 = 0;
    }
    xmlCreateDocParserCtxt(uVar28);
    xmlFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCreateDocParserCtxt",(ulong)(uint)(iVar2 - iVar1));
      local_68 = local_68 + 1;
      printf(" %d",(ulong)uVar39);
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    puVar44 = puVar44 + 1;
  } while (uVar39 != 5);
  function_tests = function_tests + 1;
  local_40 = &DAT_00163454;
  iVar1 = 0;
  local_80 = (undefined8 *)0x0;
  do {
    iVar2 = 0;
    do {
      uVar39 = 0;
      do {
        uVar24 = 0;
        do {
          piVar46 = (int *)0x0;
          ppuVar45 = &PTR_anon_var_dwarf_65b_00165d30;
          do {
            uVar51 = (uint)piVar46;
            iVar3 = xmlMemBlocks();
            if ((int)local_80 == 0) {
              uVar28 = __xmlDefaultSAXHandler();
            }
            else {
              uVar28 = 0;
            }
            pcVar41 = (char *)&call_tests;
            if (iVar2 != 0) {
              if (iVar2 == 1) {
                pcVar41 = (char *)0xffffffffffffffff;
              }
              else {
                pcVar41 = (char *)0x0;
              }
            }
            if (uVar39 == 0) {
              bVar56 = false;
              __s = "foo";
            }
            else if (uVar39 == 2) {
              bVar56 = false;
              __s = "test/ent2";
            }
            else if (uVar39 == 1) {
              bVar56 = false;
              __s = "<foo/>";
            }
            else {
              bVar56 = true;
              __s = (char *)0x0;
            }
            iVar4 = -1;
            if ((uint)uVar24 < 4) {
              iVar4 = (&DAT_00163454)[uVar24];
            }
            if (uVar51 < 5) {
              puVar43 = *ppuVar45;
            }
            else {
              puVar43 = (undefined *)0x0;
            }
            if ((bVar56) || (sVar25 = strlen(__s), iVar4 <= (int)sVar25 + 1)) {
              xmlCreatePushParserCtxt(uVar28,pcVar41,__s,iVar4,puVar43);
              xmlFreeParserCtxt();
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar4 = xmlMemBlocks();
              if (iVar3 != iVar4) {
                iVar4 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlCreatePushParserCtxt",
                       (ulong)(uint)(iVar4 - iVar3));
                iVar1 = iVar1 + 1;
                printf(" %d",local_80);
                printf(" %d",iVar2);
                printf(" %d",(ulong)uVar39);
                printf(" %d",uVar24);
                printf(" %d");
                putchar(10);
                pcVar41 = (char *)piVar46;
              }
            }
            uVar51 = uVar51 + 1;
            piVar46 = (int *)(ulong)uVar51;
            ppuVar45 = ppuVar45 + 1;
          } while (uVar51 != 6);
          uVar51 = (uint)uVar24 + 1;
          uVar24 = (ulong)uVar51;
        } while (uVar51 != 4);
        uVar39 = uVar39 + 1;
      } while (uVar39 != 4);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 3);
    bVar56 = (int)local_80 == 0;
    local_80 = (undefined8 *)(ulong)((int)local_80 + 1);
  } while (bVar56);
  function_tests = function_tests + 1;
  local_38 = &DAT_00165d90;
  iVar2 = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      uVar24 = 0;
      do {
        uVar31 = 0;
        do {
          piVar46 = (int *)0x0;
          puVar54 = &DAT_00163444;
          do {
            iVar4 = (int)pcVar41;
            iVar3 = xmlMemBlocks();
            pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar4);
            if (uVar51 < 4) {
              pcVar41 = (char *)(&DAT_00165d70)[uVar51];
            }
            else {
              pcVar41 = (char *)0x0;
            }
            if ((uint)uVar24 < 7) {
              uVar28 = (&DAT_00165d90)[uVar24];
            }
            else {
              uVar28 = 0;
            }
            if ((uint)uVar31 < 3) {
              uVar34 = (&DAT_00165d58)[uVar31];
            }
            else {
              uVar34 = 0;
            }
            uVar48 = 0x200;
            uVar36 = (uint)piVar46;
            if (uVar36 < 4) {
              uVar48 = *puVar54;
            }
            pxVar26 = (xmlDocPtr)xmlCtxtReadDoc(pxVar23,pcVar41,uVar28,uVar34,uVar48);
            if (api_doc != pxVar26) {
              xmlFreeDoc(pxVar26);
            }
            call_tests = call_tests + 1;
            if (pxVar23 != (xmlParserCtxtPtr)0x0) {
              xmlFreeParserCtxt(pxVar23);
            }
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlCtxtReadDoc",(ulong)(uint)(iVar4 - iVar3));
              iVar2 = iVar2 + 1;
              printf(" %d",(ulong)uVar39);
              printf(" %d",(ulong)uVar51);
              printf(" %d",uVar24);
              printf(" %d",uVar31);
              printf(" %d");
              putchar(10);
              pcVar41 = (char *)piVar46;
            }
            uVar36 = uVar36 + 1;
            piVar46 = (int *)(ulong)uVar36;
            puVar54 = puVar54 + 1;
          } while (uVar36 != 5);
          uVar36 = (uint)uVar31 + 1;
          uVar31 = (ulong)uVar36;
        } while (uVar36 != 4);
        uVar36 = (uint)uVar24 + 1;
        uVar24 = (ulong)uVar36;
      } while (uVar36 != 8);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 5);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  iVar3 = local_94 + iVar47 + local_64 + local_68;
  function_tests = function_tests + 1;
  iVar47 = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      uVar24 = 0;
      do {
        puVar54 = &DAT_00163444;
        piVar46 = (int *)0x0;
        do {
          iVar5 = (int)pcVar41;
          iVar4 = xmlMemBlocks();
          pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar5);
          if (uVar51 < 7) {
            pcVar41 = (char *)(&DAT_00165d90)[uVar51];
          }
          else {
            pcVar41 = (char *)0x0;
          }
          if ((uint)uVar24 < 3) {
            uVar28 = (&DAT_00165d58)[uVar24];
          }
          else {
            uVar28 = 0;
          }
          uVar48 = 0x200;
          uVar36 = (uint)piVar46;
          if (uVar36 < 4) {
            uVar48 = *puVar54;
          }
          pxVar26 = (xmlDocPtr)xmlCtxtReadFile(pxVar23,pcVar41,uVar28,uVar48);
          if (api_doc != pxVar26) {
            xmlFreeDoc(pxVar26);
          }
          call_tests = call_tests + 1;
          if (pxVar23 != (xmlParserCtxtPtr)0x0) {
            xmlFreeParserCtxt(pxVar23);
          }
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar4 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCtxtReadFile",(ulong)(uint)(iVar5 - iVar4));
            iVar47 = iVar47 + 1;
            printf(" %d",(ulong)uVar39);
            printf(" %d",(ulong)uVar51);
            printf(" %d",uVar24);
            printf(" %d");
            putchar(10);
            pcVar41 = (char *)piVar46;
          }
          uVar36 = uVar36 + 1;
          piVar46 = (int *)(ulong)uVar36;
          puVar54 = puVar54 + 1;
        } while (uVar36 != 5);
        uVar36 = (uint)uVar24 + 1;
        uVar24 = (ulong)uVar36;
      } while (uVar36 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 8);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar39 = 0;
  do {
    iVar4 = 0;
    do {
      uVar24 = 0;
      do {
        uVar31 = 0;
        do {
          uVar51 = 0;
          do {
            uVar36 = 0;
            do {
              iVar6 = (int)pcVar41;
              iVar5 = xmlMemBlocks();
              pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar6);
              if (iVar4 == 0) {
                bVar56 = false;
                pcVar41 = "foo";
              }
              else if (iVar4 == 2) {
                bVar56 = false;
                pcVar41 = "test/ent2";
              }
              else if (iVar4 == 1) {
                bVar56 = false;
                pcVar41 = "<foo/>";
              }
              else {
                bVar56 = true;
                pcVar41 = (char *)0x0;
              }
              iVar6 = -1;
              if ((uint)uVar24 < 4) {
                iVar6 = (&DAT_00163454)[uVar24];
              }
              if ((bVar56) || (sVar25 = strlen(pcVar41), iVar6 <= (int)sVar25 + 1)) {
                pxVar26 = (xmlDocPtr)xmlCtxtReadMemory();
                if (api_doc != pxVar26) {
                  xmlFreeDoc(pxVar26);
                }
                call_tests = call_tests + 1;
                if (pxVar23 != (xmlParserCtxtPtr)0x0) {
                  xmlFreeParserCtxt(pxVar23);
                }
                xmlResetLastError();
                iVar6 = xmlMemBlocks();
                if (iVar5 != iVar6) {
                  iVar6 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlCtxtReadMemory",(ulong)(uint)(iVar6 - iVar5)
                        );
                  local_64 = local_64 + 1;
                  printf(" %d",(ulong)uVar39);
                  printf(" %d",iVar4);
                  printf(" %d",uVar24);
                  printf(" %d",uVar31);
                  printf(" %d",(ulong)uVar51);
                  pcVar41 = (char *)(ulong)uVar36;
                  printf(" %d");
                  putchar(10);
                }
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 != 5);
            uVar51 = uVar51 + 1;
          } while (uVar51 != 4);
          uVar51 = (int)uVar31 + 1;
          uVar31 = (ulong)uVar51;
        } while (uVar51 != 8);
        uVar51 = (uint)uVar24 + 1;
        uVar24 = (ulong)uVar51;
      } while (uVar51 != 4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  uVar39 = 0;
  local_68 = 0;
  do {
    iVar4 = xmlMemBlocks();
    pxVar23 = gen_xmlParserCtxtPtr(uVar39,(int)pcVar41);
    xmlCtxtReset(pxVar23);
    call_tests = call_tests + 1;
    if (pxVar23 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar23);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtReset",(ulong)(uint)(iVar5 - iVar4));
      local_68 = local_68 + 1;
      pcVar41 = (char *)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar39 = 0;
  do {
    iVar5 = 0;
    do {
      uVar24 = 0;
      do {
        uVar51 = 0;
        do {
          piVar46 = (int *)0x0;
          puVar44 = &DAT_00165d58;
          do {
            iVar7 = (int)pcVar41;
            iVar6 = xmlMemBlocks();
            pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar7);
            if (iVar5 == 0) {
              bVar56 = false;
              pcVar41 = "foo";
            }
            else if (iVar5 == 2) {
              bVar56 = false;
              pcVar41 = "test/ent2";
            }
            else if (iVar5 == 1) {
              bVar56 = false;
              pcVar41 = "<foo/>";
            }
            else {
              bVar56 = true;
              pcVar41 = (char *)0x0;
            }
            iVar7 = -1;
            if ((uint)uVar24 < 4) {
              iVar7 = (&DAT_00163454)[uVar24];
            }
            if (uVar51 < 7) {
              uVar28 = (&DAT_00165d90)[uVar51];
            }
            else {
              uVar28 = 0;
            }
            uVar36 = (uint)piVar46;
            if (uVar36 < 3) {
              uVar34 = *puVar44;
            }
            else {
              uVar34 = 0;
            }
            if ((bVar56) || (sVar25 = strlen(pcVar41), iVar7 <= (int)sVar25 + 1)) {
              xmlCtxtResetPush(pxVar23,pcVar41,iVar7,uVar28,uVar34);
              call_tests = call_tests + 1;
              if (pxVar23 != (xmlParserCtxtPtr)0x0) {
                xmlFreeParserCtxt(pxVar23);
              }
              xmlResetLastError();
              iVar7 = xmlMemBlocks();
              if (iVar6 != iVar7) {
                iVar7 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlCtxtResetPush",(ulong)(uint)(iVar7 - iVar6));
                iVar4 = iVar4 + 1;
                printf(" %d",(ulong)uVar39);
                printf(" %d",iVar5);
                printf(" %d",uVar24);
                printf(" %d",(ulong)uVar51);
                printf(" %d");
                putchar(10);
                pcVar41 = (char *)piVar46;
              }
            }
            uVar36 = uVar36 + 1;
            piVar46 = (int *)(ulong)uVar36;
            puVar44 = puVar44 + 1;
          } while (uVar36 != 4);
          uVar51 = uVar51 + 1;
        } while (uVar51 != 8);
        uVar51 = (uint)uVar24 + 1;
        uVar24 = (ulong)uVar51;
      } while (uVar51 != 4);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  iVar47 = iVar3 + iVar1 + iVar2 + iVar47 + local_64;
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar39 = 0;
  do {
    puVar37 = &DAT_00163444;
    piVar46 = (int *)0x0;
    do {
      iVar3 = (int)pcVar41;
      iVar2 = xmlMemBlocks();
      pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar3);
      pcVar41 = (char *)0x200;
      uVar51 = (uint)piVar46;
      if (uVar51 < 4) {
        pcVar41 = (char *)(ulong)*puVar37;
      }
      xmlCtxtUseOptions(pxVar23);
      call_tests = call_tests + 1;
      if (pxVar23 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt(pxVar23);
      }
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCtxtUseOptions",(ulong)(uint)(iVar3 - iVar2));
        iVar1 = iVar1 + 1;
        printf(" %d",(ulong)uVar39);
        printf(" %d");
        putchar(10);
        pcVar41 = (char *)piVar46;
      }
      uVar51 = uVar51 + 1;
      piVar46 = (int *)(ulong)uVar51;
      puVar37 = puVar37 + 1;
    } while (uVar51 != 5);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      piVar46 = (int *)0x0;
      do {
        iVar5 = (int)pcVar41;
        iVar3 = xmlMemBlocks();
        pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar5);
        if (uVar51 < 3) {
          pcVar41 = (char *)(&DAT_00165d58)[uVar51];
        }
        else {
          pcVar41 = (char *)0x0;
        }
        xmlGetFeature(pxVar23,pcVar41,0);
        call_tests = call_tests + 1;
        if (pxVar23 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar23);
        }
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        iVar6 = (int)piVar46;
        if (iVar3 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlGetFeature",(ulong)(uint)(iVar5 - iVar3));
          iVar2 = iVar2 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          putchar(10);
          pcVar41 = (char *)piVar46;
        }
        uVar36 = iVar6 + 1;
        piVar46 = (int *)(ulong)uVar36;
      } while (uVar36 == 1);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar5 = 0;
  iVar3 = 0;
  do {
    piVar46 = (int *)0x0;
    if (iVar3 == 0) {
      piVar46 = inttab;
    }
    iVar6 = xmlMemBlocks();
    local_88 = (xmlParserInputBufferPtr)0x0;
    xmlGetFeaturesList(piVar46);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlGetFeaturesList",(ulong)(uint)(iVar7 - iVar6));
      iVar5 = iVar5 + 1;
      printf(" %d");
      local_88 = (xmlParserInputBufferPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 == 1);
  function_tests = function_tests + 1;
  uVar39 = 0xffffffff;
  iVar3 = 0;
  do {
    iVar6 = xmlMemBlocks();
    uVar48 = 0;
    if (uVar39 < 3) {
      uVar48 = (&DAT_001551e0)[uVar39];
    }
    uVar39 = uVar39 + 1;
    xmlHasFeature(uVar48);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlHasFeature",(ulong)(uint)(iVar7 - iVar6));
      iVar3 = iVar3 + 1;
      local_88 = (xmlParserInputBufferPtr)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  do {
    iVar7 = 0;
    do {
      uVar39 = 0;
      puVar54 = &DAT_00155228;
      do {
        iVar8 = (int)local_88;
        if (iVar6 == 0) {
          uVar28 = __xmlDefaultSAXHandler();
        }
        else {
          uVar28 = 0;
        }
        local_88 = gen_xmlParserInputBufferPtr(iVar7,iVar8);
        uVar48 = 0xffffffff;
        if (uVar39 < 3) {
          uVar48 = *puVar54;
        }
        pxVar27 = (xmlNodePtr)xmlIOParseDTD(uVar28,local_88,uVar48);
        desret_xmlNodePtr(pxVar27);
        call_tests = call_tests + 1;
        xmlFreeParserInputBuffer(0);
        xmlResetLastError();
        uVar39 = uVar39 + 1;
        puVar54 = puVar54 + 1;
      } while (uVar39 != 4);
      iVar7 = iVar7 + 1;
    } while (iVar7 != 8);
    bVar56 = iVar6 == 0;
    iVar6 = iVar6 + 1;
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlInitNodeInfoSeq(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlInitNodeInfoSeq");
    local_88 = (xmlParserInputBufferPtr)0x0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  xmlInitParser();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar8 != iVar9) {
    iVar10 = xmlMemBlocks();
    local_88 = (xmlParserInputBufferPtr)(ulong)(uint)(iVar10 - iVar8);
    printf("Leak of %d blocks found in xmlInitParser");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar39 = 0;
  iVar10 = 0;
  do {
    iVar11 = xmlMemBlocks();
    pxVar23 = gen_xmlParserCtxtPtr(uVar39,(int)local_88);
    xmlInitParserCtxt(pxVar23);
    call_tests = call_tests + 1;
    if (pxVar23 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar23);
    }
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlInitParserCtxt",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      local_88 = (xmlParserInputBufferPtr)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  uVar39 = 0;
  iVar11 = 0;
  do {
    iVar12 = xmlMemBlocks();
    uVar48 = 0xffffffff;
    if (uVar39 < 4) {
      uVar48 = *local_40;
    }
    xmlKeepBlanksDefault(uVar48);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar12 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlKeepBlanksDefault",(ulong)(uint)(iVar13 - iVar12));
      iVar11 = iVar11 + 1;
      local_88 = (xmlParserInputBufferPtr)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    local_40 = local_40 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  puVar54 = &DAT_00163454;
  uVar39 = 0;
  iVar12 = 0;
  do {
    iVar13 = xmlMemBlocks();
    uVar48 = 0xffffffff;
    if (uVar39 < 4) {
      uVar48 = *puVar54;
    }
    xmlLineNumbersDefault(uVar48);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLineNumbersDefault",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      local_88 = (xmlParserInputBufferPtr)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    puVar54 = puVar54 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  iVar13 = 0;
  uVar39 = 0;
  do {
    uVar24 = 0;
    do {
      uVar51 = 0;
      do {
        iVar15 = (int)local_88;
        iVar14 = xmlMemBlocks();
        if (uVar39 < 7) {
          uVar28 = (&DAT_00165d90)[uVar39];
        }
        else {
          uVar28 = 0;
        }
        if ((uint)uVar24 < 3) {
          local_88 = (xmlParserInputBufferPtr)(&DAT_00165d58)[uVar24];
        }
        else {
          local_88 = (xmlParserInputBufferPtr)0x0;
        }
        pxVar23 = gen_xmlParserCtxtPtr(uVar51,iVar15);
        uVar28 = xmlLoadExternalEntity(uVar28,local_88,pxVar23);
        xmlFreeInputStream(uVar28);
        call_tests = call_tests + 1;
        if (pxVar23 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar23);
        }
        xmlResetLastError();
        iVar15 = xmlMemBlocks();
        if (iVar14 != iVar15) {
          iVar15 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlLoadExternalEntity",(ulong)(uint)(iVar15 - iVar14));
          iVar13 = iVar13 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",uVar24);
          local_88 = (xmlParserInputBufferPtr)(ulong)uVar51;
          printf(" %d");
          putchar(10);
        }
        uVar51 = uVar51 + 1;
      } while (uVar51 != 3);
      uVar51 = (uint)uVar24 + 1;
      uVar24 = (ulong)uVar51;
    } while (uVar51 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 8);
  function_tests = function_tests + 1;
  iVar14 = 0;
  uVar39 = 0;
  do {
    uVar24 = 0;
    do {
      uVar51 = 0;
      puVar54 = &DAT_00155228;
      do {
        iVar16 = (int)local_88;
        iVar15 = xmlMemBlocks();
        pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar16);
        pxVar29 = gen_xmlParserInputBufferPtr((int)uVar24,iVar16);
        uVar48 = 0xffffffff;
        if (uVar51 < 3) {
          uVar48 = *puVar54;
        }
        local_88 = pxVar29;
        lVar30 = xmlNewIOInputStream(pxVar23,pxVar29,uVar48);
        if (lVar30 != 0) {
          pxVar29 = (xmlParserInputBufferPtr)0x0;
        }
        xmlFreeInputStream(lVar30);
        call_tests = call_tests + 1;
        if (pxVar23 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar23);
        }
        xmlFreeParserInputBuffer(pxVar29);
        xmlResetLastError();
        iVar16 = xmlMemBlocks();
        if (iVar15 != iVar16) {
          iVar16 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewIOInputStream",(ulong)(uint)(iVar16 - iVar15));
          iVar14 = iVar14 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",uVar24);
          local_88 = (xmlParserInputBufferPtr)(ulong)uVar51;
          printf(" %d");
          putchar(10);
        }
        uVar51 = uVar51 + 1;
        puVar54 = puVar54 + 1;
      } while (uVar51 != 4);
      uVar51 = (int)uVar24 + 1;
      uVar24 = (ulong)uVar51;
    } while (uVar51 != 8);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar15 = xmlMemBlocks();
  uVar28 = xmlNewParserCtxt();
  xmlFreeParserCtxt(uVar28);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar16 = xmlMemBlocks();
  if (iVar15 != iVar16) {
    iVar17 = xmlMemBlocks();
    local_88 = (xmlParserInputBufferPtr)(ulong)(uint)(iVar17 - iVar15);
    printf("Leak of %d blocks found in xmlNewParserCtxt");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar17 = 0;
  uVar39 = 0;
  do {
    local_78 = (undefined4 *)0x0;
    do {
      iVar49 = 0;
      do {
        uVar24 = 0;
        do {
          local_80 = &DAT_00165d70;
          uVar51 = 0;
          do {
            iVar19 = (int)local_88;
            iVar18 = xmlMemBlocks();
            pxVar26 = gen_xmlDocPtr(uVar39,iVar19);
            if ((int)local_78 == 0) {
              local_88 = (xmlParserInputBufferPtr)__xmlDefaultSAXHandler();
            }
            else {
              local_88 = (xmlParserInputBufferPtr)0x0;
            }
            piVar46 = &call_tests;
            if (iVar49 != 0) {
              if (iVar49 == 1) {
                piVar46 = (int *)0xffffffffffffffff;
              }
              else {
                piVar46 = (int *)0x0;
              }
            }
            uVar48 = 0xffffffff;
            if ((uint)uVar24 < 4) {
              uVar48 = (&DAT_00163454)[uVar24];
            }
            if (uVar51 < 4) {
              uVar28 = *local_80;
            }
            else {
              uVar28 = 0;
            }
            pxVar29 = (xmlParserInputBufferPtr)__xmlDefaultSAXHandler();
            if (local_88 == pxVar29) {
              piVar46 = (int *)0x0;
            }
            xmlParseBalancedChunkMemory(pxVar26,local_88,piVar46,uVar48,uVar28,0);
            call_tests = call_tests + 1;
            if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc))
            {
              xmlFreeDoc(pxVar26);
            }
            xmlResetLastError();
            iVar19 = xmlMemBlocks();
            if (iVar18 != iVar19) {
              iVar19 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlParseBalancedChunkMemory",
                     (ulong)(uint)(iVar19 - iVar18));
              iVar17 = iVar17 + 1;
              printf(" %d",(ulong)uVar39);
              printf(" %d",local_78);
              printf(" %d",iVar49);
              printf(" %d",uVar24);
              printf(" %d");
              local_88 = (xmlParserInputBufferPtr)0x0;
              printf(" %d");
              putchar(10);
            }
            uVar51 = uVar51 + 1;
            local_80 = local_80 + 1;
          } while (uVar51 != 5);
          uVar51 = (uint)uVar24 + 1;
          uVar24 = (ulong)uVar51;
        } while (uVar51 != 4);
        iVar49 = iVar49 + 1;
      } while (iVar49 != 3);
      bVar56 = (int)local_78 == 0;
      local_78 = (undefined4 *)(ulong)((int)local_78 + 1);
    } while (bVar56);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar39 = 0;
  do {
    local_70 = 0;
    do {
      iVar49 = 0;
      do {
        uVar24 = 0;
        do {
          uVar31 = 0;
          do {
            local_78 = &DAT_00163454;
            uVar51 = 0;
            do {
              uVar48 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
              iVar19 = (int)local_88;
              iVar18 = xmlMemBlocks();
              pxVar26 = gen_xmlDocPtr(uVar39,iVar19);
              if ((int)local_70 == 0) {
                local_88 = (xmlParserInputBufferPtr)__xmlDefaultSAXHandler();
              }
              else {
                local_88 = (xmlParserInputBufferPtr)0x0;
              }
              piVar46 = &call_tests;
              if (iVar49 != 0) {
                if (iVar49 == 1) {
                  piVar46 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar46 = (int *)0x0;
                }
              }
              uVar52 = 0xffffffff;
              if ((uint)uVar24 < 4) {
                uVar52 = (&DAT_00163454)[uVar24];
              }
              if ((uint)uVar31 < 4) {
                uVar28 = (&DAT_00165d70)[uVar31];
              }
              else {
                uVar28 = 0;
              }
              uVar50 = 0xffffffff;
              if (uVar51 < 4) {
                uVar50 = *local_78;
              }
              pxVar29 = (xmlParserInputBufferPtr)__xmlDefaultSAXHandler();
              if (local_88 == pxVar29) {
                piVar46 = (int *)0x0;
              }
              in_stack_ffffffffffffff58 = CONCAT44(uVar48,uVar50);
              xmlParseBalancedChunkMemoryRecover
                        (pxVar26,local_88,piVar46,uVar52,uVar28,0,in_stack_ffffffffffffff58);
              call_tests = call_tests + 1;
              if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar26);
              }
              xmlResetLastError();
              iVar19 = xmlMemBlocks();
              if (iVar18 != iVar19) {
                iVar19 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlParseBalancedChunkMemoryRecover",
                       (ulong)(uint)(iVar19 - iVar18));
                local_64 = local_64 + 1;
                printf(" %d",(ulong)uVar39);
                printf(" %d",local_70);
                printf(" %d",iVar49);
                printf(" %d",uVar24);
                printf(" %d",uVar31);
                printf(" %d",0);
                local_88 = (xmlParserInputBufferPtr)(ulong)uVar51;
                printf(" %d");
                putchar(10);
              }
              uVar51 = uVar51 + 1;
              local_78 = local_78 + 1;
            } while (uVar51 != 4);
            uVar51 = (uint)uVar31 + 1;
            uVar31 = (ulong)uVar51;
          } while (uVar51 != 5);
          uVar51 = (uint)uVar24 + 1;
          uVar24 = (ulong)uVar51;
        } while (uVar51 != 4);
        iVar49 = iVar49 + 1;
      } while (iVar49 != 3);
      bVar56 = (int)local_70 == 0;
      local_70 = (ulong)((int)local_70 + 1);
    } while (bVar56);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 4);
  local_50._0_4_ = (uint)(iVar15 != iVar16);
  function_tests = function_tests + 1;
  local_70._0_4_ = 0;
  uVar39 = 0;
  do {
    iVar15 = 0;
    do {
      uVar51 = 0;
      do {
        puVar54 = &DAT_00163454;
        pxVar29 = (xmlParserInputBufferPtr)0x0;
        do {
          iVar16 = xmlMemBlocks();
          pxVar23 = gen_xmlParserCtxtPtr(uVar39,(int)local_88);
          if (iVar15 == 0) {
            bVar56 = false;
            pcVar41 = "foo";
          }
          else if (iVar15 == 2) {
            bVar56 = false;
            pcVar41 = "test/ent2";
          }
          else if (iVar15 == 1) {
            bVar56 = false;
            pcVar41 = "<foo/>";
          }
          else {
            bVar56 = true;
            pcVar41 = (char *)0x0;
          }
          uVar48 = 0xffffffff;
          iVar49 = -1;
          if (uVar51 < 4) {
            iVar49 = (&DAT_00163454)[uVar51];
          }
          uVar36 = (uint)pxVar29;
          if (uVar36 < 4) {
            uVar48 = *puVar54;
          }
          if ((bVar56) || (sVar25 = strlen(pcVar41), iVar49 <= (int)sVar25 + 1)) {
            xmlParseChunk(pxVar23,pcVar41,iVar49,uVar48);
            if (pxVar23 == (xmlParserCtxtPtr)0x0) {
              call_tests = call_tests + 1;
            }
            else {
              xmlFreeDoc(pxVar23->myDoc);
              pxVar23->myDoc = (xmlDocPtr)0x0;
              call_tests = call_tests + 1;
              xmlFreeParserCtxt(pxVar23);
            }
            xmlResetLastError();
            iVar49 = xmlMemBlocks();
            local_88 = (xmlParserInputBufferPtr)pcVar41;
            if (iVar16 != iVar49) {
              iVar49 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlParseChunk",(ulong)(uint)(iVar49 - iVar16));
              local_70._0_4_ = (int)local_70 + 1;
              printf(" %d",(ulong)uVar39);
              printf(" %d",iVar15);
              printf(" %d",(ulong)uVar51);
              printf(" %d");
              putchar(10);
              local_88 = pxVar29;
            }
          }
          uVar36 = uVar36 + 1;
          pxVar29 = (xmlParserInputBufferPtr)(ulong)uVar36;
          puVar54 = puVar54 + 1;
        } while (uVar36 != 4);
        uVar51 = uVar51 + 1;
      } while (uVar51 != 4);
      iVar15 = iVar15 + 1;
    } while (iVar15 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar15 = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      uVar36 = 0;
      puVar44 = &DAT_00165d70;
      do {
        iVar49 = (int)local_88;
        iVar16 = xmlMemBlocks();
        pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar49);
        if (uVar51 < 4) {
          local_88 = (xmlParserInputBufferPtr)(&DAT_00165d70)[uVar51];
        }
        else {
          local_88 = (xmlParserInputBufferPtr)0x0;
        }
        if (uVar36 < 4) {
          uVar28 = *puVar44;
        }
        else {
          uVar28 = 0;
        }
        xmlParseCtxtExternalEntity(pxVar23,local_88,uVar28,0);
        call_tests = call_tests + 1;
        if (pxVar23 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar23);
        }
        xmlResetLastError();
        iVar49 = xmlMemBlocks();
        if (iVar16 != iVar49) {
          iVar49 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlParseCtxtExternalEntity",
                 (ulong)(uint)(iVar49 - iVar16));
          iVar15 = iVar15 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          local_88 = (xmlParserInputBufferPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        uVar36 = uVar36 + 1;
        puVar44 = puVar44 + 1;
      } while (uVar36 != 5);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 5);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar16 = 0;
  uVar39 = 0;
  do {
    puVar44 = &DAT_00165d70;
    uVar51 = 0;
    do {
      iVar49 = xmlMemBlocks();
      if (uVar39 < 4) {
        uVar28 = (&DAT_00165d70)[uVar39];
      }
      else {
        uVar28 = 0;
      }
      if (uVar51 < 4) {
        pxVar27 = (xmlNodePtr)*puVar44;
      }
      else {
        pxVar27 = (xmlNodePtr)0x0;
      }
      pxVar32 = (xmlNodePtr)xmlParseDTD(uVar28);
      desret_xmlNodePtr(pxVar32);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      if (iVar49 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParseDTD",(ulong)(uint)(iVar18 - iVar49));
        iVar16 = iVar16 + 1;
        printf(" %d",(ulong)uVar39);
        pxVar27 = (xmlNodePtr)(ulong)uVar51;
        printf(" %d");
        putchar(10);
      }
      uVar51 = uVar51 + 1;
      puVar44 = puVar44 + 1;
    } while (uVar51 != 5);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 5);
  iVar47 = iVar47 + local_68 + iVar4 + iVar1 + iVar2 + iVar5 + iVar3 + (uint)(iVar6 != iVar7) +
           (uint)(iVar8 != iVar9) + iVar10 + iVar11 + iVar12 + iVar13 + iVar14 + (uint)local_50 +
           iVar17 + local_64 + (int)local_70;
  function_tests = function_tests + 1;
  puVar44 = &DAT_00165d70;
  uVar39 = 0;
  iVar1 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (uVar39 < 4) {
      uVar28 = *puVar44;
    }
    else {
      uVar28 = 0;
    }
    pxVar26 = (xmlDocPtr)xmlParseDoc(uVar28);
    if (api_doc != pxVar26) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseDoc",(ulong)(uint)(iVar3 - iVar2));
      iVar1 = iVar1 + 1;
      pxVar27 = (xmlNodePtr)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    puVar44 = puVar44 + 1;
  } while (uVar39 != 5);
  function_tests = function_tests + 1;
  uVar39 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    pxVar23 = gen_xmlParserCtxtPtr(uVar39,(int)pxVar27);
    xmlParseDocument(pxVar23);
    if (pxVar23 == (xmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar23->myDoc);
      pxVar23->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      xmlFreeParserCtxt(pxVar23);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseDocument",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      pxVar27 = (xmlNodePtr)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  uVar39 = 0;
  iVar3 = 0;
  do {
    iVar4 = xmlMemBlocks();
    if (uVar39 < 7) {
      uVar28 = *local_38;
    }
    else {
      uVar28 = 0;
    }
    pxVar26 = (xmlDocPtr)xmlParseEntity(uVar28);
    if (api_doc != pxVar26) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseEntity",(ulong)(uint)(iVar5 - iVar4));
      iVar3 = iVar3 + 1;
      pxVar27 = (xmlNodePtr)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    local_38 = local_38 + 1;
  } while (uVar39 != 8);
  function_tests = function_tests + 1;
  uVar39 = 0;
  local_70._0_4_ = 0;
  do {
    iVar4 = xmlMemBlocks();
    pxVar23 = gen_xmlParserCtxtPtr(uVar39,(int)pxVar27);
    xmlParseExtParsedEnt(pxVar23);
    if (pxVar23 == (xmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar23->myDoc);
      pxVar23->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      xmlFreeParserCtxt(pxVar23);
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseExtParsedEnt",(ulong)(uint)(iVar5 - iVar4));
      local_70._0_4_ = (int)local_70 + 1;
      pxVar27 = (xmlNodePtr)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar4 = 0;
  uVar39 = 0;
  do {
    local_88 = (xmlParserInputBufferPtr)0x0;
    do {
      uVar24 = 0;
      do {
        uVar51 = 0;
        do {
          uVar36 = 0;
          do {
            puVar44 = &DAT_00165d70;
            uVar40 = 0;
            do {
              iVar6 = (int)pxVar27;
              iVar5 = xmlMemBlocks();
              pxVar26 = gen_xmlDocPtr(uVar39,iVar6);
              if ((int)local_88 == 0) {
                pxVar27 = (xmlNodePtr)__xmlDefaultSAXHandler();
              }
              else {
                pxVar27 = (xmlNodePtr)0x0;
              }
              piVar46 = &call_tests;
              iVar6 = (int)uVar24;
              if (iVar6 != 0) {
                if (iVar6 == 1) {
                  piVar46 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar46 = (int *)0x0;
                }
              }
              uVar48 = 0xffffffff;
              if (uVar51 < 4) {
                uVar48 = (&DAT_00163454)[uVar51];
              }
              if (uVar36 < 4) {
                uVar28 = (&DAT_00165d70)[uVar36];
              }
              else {
                uVar28 = 0;
              }
              if (uVar40 < 4) {
                uVar34 = *puVar44;
              }
              else {
                uVar34 = 0;
              }
              xmlParseExternalEntity(pxVar26,pxVar27,piVar46,uVar48,uVar28,uVar34,0);
              call_tests = call_tests + 1;
              if (((pxVar26 != (xmlDocPtr)0x0) && (api_doc != pxVar26)) && (pxVar26->doc != api_doc)
                 ) {
                xmlFreeDoc(pxVar26);
              }
              xmlResetLastError();
              iVar7 = xmlMemBlocks();
              if (iVar5 != iVar7) {
                iVar7 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlParseExternalEntity",
                       (ulong)(uint)(iVar7 - iVar5));
                iVar4 = iVar4 + 1;
                printf(" %d",(ulong)uVar39);
                printf(" %d",local_88);
                printf(" %d",uVar24);
                printf(" %d",(ulong)uVar51);
                printf(" %d",(ulong)uVar36);
                printf(" %d");
                pxVar27 = (xmlNodePtr)0x0;
                printf(" %d");
                putchar(10);
              }
              uVar40 = uVar40 + 1;
              puVar44 = puVar44 + 1;
            } while (uVar40 != 5);
            uVar36 = uVar36 + 1;
          } while (uVar36 != 5);
          uVar51 = uVar51 + 1;
        } while (uVar51 != 4);
        uVar24 = (ulong)(iVar6 + 1U);
      } while (iVar6 + 1U != 3);
      bVar56 = (int)local_88 == 0;
      local_88 = (xmlParserInputBufferPtr)(ulong)((int)local_88 + 1);
    } while (bVar56);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  puVar44 = &DAT_00165d90;
  uVar39 = 0;
  local_80._0_4_ = 0;
  do {
    iVar5 = xmlMemBlocks();
    if (uVar39 < 7) {
      uVar28 = *puVar44;
    }
    else {
      uVar28 = 0;
    }
    pxVar26 = (xmlDocPtr)xmlParseFile(uVar28);
    if (api_doc != pxVar26) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar5 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseFile",(ulong)(uint)(iVar6 - iVar5));
      local_80._0_4_ = (int)local_80 + 1;
      pxVar27 = (xmlNodePtr)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    puVar44 = puVar44 + 1;
  } while (uVar39 != 8);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      uVar24 = 0;
      do {
        puVar54 = &DAT_00163444;
        uVar36 = 0;
        do {
          iVar7 = (int)pxVar27;
          iVar6 = xmlMemBlocks();
          pxVar27 = gen_xmlNodePtr(uVar39,iVar7);
          if (uVar51 < 3) {
            uVar28 = (&DAT_00165d58)[uVar51];
          }
          else {
            uVar28 = 0;
          }
          uVar48 = 0xffffffff;
          if ((uint)uVar24 < 4) {
            uVar48 = (&DAT_00163454)[uVar24];
          }
          uVar52 = 0x200;
          if (uVar36 < 4) {
            uVar52 = *puVar54;
          }
          xmlParseInNodeContext(pxVar27,uVar28,uVar48,uVar52,0);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar39,pxVar27,nr);
          xmlResetLastError();
          iVar7 = xmlMemBlocks();
          if (iVar6 != iVar7) {
            iVar7 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlParseInNodeContext",(ulong)(uint)(iVar7 - iVar6));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar39);
            printf(" %d",(ulong)uVar51);
            printf(" %d",uVar24);
            printf(" %d");
            pxVar27 = (xmlNodePtr)0x0;
            printf(" %d");
            putchar(10);
          }
          uVar36 = uVar36 + 1;
          puVar54 = puVar54 + 1;
        } while (uVar36 != 5);
        uVar36 = (uint)uVar24 + 1;
        uVar24 = (ulong)uVar36;
      } while (uVar36 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar39 = 0;
  do {
    puVar37 = &DAT_00163454;
    pxVar32 = (xmlNodePtr)0x0;
    do {
      iVar7 = xmlMemBlocks();
      if (uVar39 == 0) {
        bVar56 = false;
        pcVar41 = "foo";
      }
      else if (uVar39 == 2) {
        bVar56 = false;
        pcVar41 = "test/ent2";
      }
      else if (uVar39 == 1) {
        bVar56 = false;
        pcVar41 = "<foo/>";
      }
      else {
        bVar56 = true;
        pcVar41 = (char *)0x0;
      }
      uVar51 = 0xffffffff;
      uVar36 = (uint)pxVar32;
      if (uVar36 < 4) {
        uVar51 = *puVar37;
      }
      if ((bVar56) || (sVar25 = strlen(pcVar41), (int)uVar51 <= (int)sVar25 + 1)) {
        pxVar27 = (xmlNodePtr)(ulong)uVar51;
        pxVar26 = (xmlDocPtr)xmlParseMemory(pcVar41);
        if (api_doc != pxVar26) {
          xmlFreeDoc(pxVar26);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlParseMemory",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d");
          putchar(10);
          pxVar27 = pxVar32;
        }
      }
      uVar36 = uVar36 + 1;
      pxVar32 = (xmlNodePtr)(ulong)uVar36;
      puVar37 = puVar37 + 1;
    } while (uVar36 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  iVar8 = 0;
  iVar7 = 0;
  do {
    iVar10 = (int)pxVar27;
    iVar9 = xmlMemBlocks();
    pxVar23 = gen_xmlParserCtxtPtr(iVar7,iVar10);
    pxVar27 = (xmlNodePtr)0x0;
    xmlParserAddNodeInfo(pxVar23);
    call_tests = call_tests + 1;
    if (pxVar23 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar23);
    }
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParserAddNodeInfo",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      printf(" %d");
      pxVar27 = (xmlNodePtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar7 = iVar7 + 1;
  } while (iVar7 != 3);
  function_tests = function_tests + 1;
  iVar7 = xmlMemBlocks();
  xmlParserFindNodeInfo(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar9 = xmlMemBlocks();
  if (iVar7 != iVar9) {
    iVar10 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserFindNodeInfo",(ulong)(uint)(iVar10 - iVar7));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar10 = xmlMemBlocks();
  xmlParserFindNodeInfoIndex(0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar11 = xmlMemBlocks();
  if (iVar10 != iVar11) {
    iVar12 = xmlMemBlocks();
    printf("Leak of %d blocks found in xmlParserFindNodeInfoIndex",(ulong)(uint)(iVar12 - iVar10));
    printf(" %d",0);
    printf(" %d",0);
    putchar(10);
  }
  function_tests = function_tests + 1;
  puVar54 = &DAT_00163454;
  uVar39 = 0;
  iVar12 = 0;
  do {
    iVar13 = xmlMemBlocks();
    uVar48 = 0xffffffff;
    if (uVar39 < 4) {
      uVar48 = *puVar54;
    }
    xmlParserInputGrow(0,uVar48);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar13 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParserInputGrow",(ulong)(uint)(iVar14 - iVar13));
      iVar12 = iVar12 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar39);
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    puVar54 = puVar54 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  puVar54 = &DAT_00163454;
  uVar39 = 0;
  iVar13 = 0;
  do {
    iVar14 = xmlMemBlocks();
    uVar48 = 0xffffffff;
    if (uVar39 < 4) {
      uVar48 = *puVar54;
    }
    xmlParserInputRead(0,uVar48);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar14 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParserInputRead",(ulong)(uint)(iVar17 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar39);
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    puVar54 = puVar54 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  uVar39 = 0;
  local_90._0_4_ = 0;
  do {
    iVar14 = xmlMemBlocks();
    xmlPedanticParserDefault();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar17 = xmlMemBlocks();
    if (iVar14 != iVar17) {
      iVar17 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPedanticParserDefault",(ulong)(uint)(iVar17 - iVar14));
      local_90._0_4_ = (int)local_90 + 1;
      printf(" %d",(ulong)uVar39);
      putchar(10);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  local_50 = &DAT_00165d70;
  local_48 = &DAT_00165d90;
  local_68 = 0;
  uVar39 = 0;
  do {
    uVar24 = 0;
    do {
      uVar51 = 0;
      do {
        puVar54 = &DAT_00163444;
        uVar36 = 0;
        do {
          iVar14 = xmlMemBlocks();
          if (uVar39 < 4) {
            uVar28 = (&DAT_00165d70)[uVar39];
          }
          else {
            uVar28 = 0;
          }
          if ((uint)uVar24 < 7) {
            uVar34 = (&DAT_00165d90)[uVar24];
          }
          else {
            uVar34 = 0;
          }
          if (uVar51 < 3) {
            uVar35 = (&DAT_00165d58)[uVar51];
          }
          else {
            uVar35 = 0;
          }
          uVar48 = 0x200;
          if (uVar36 < 4) {
            uVar48 = *puVar54;
          }
          pxVar26 = (xmlDocPtr)xmlReadDoc(uVar28,uVar34,uVar35,uVar48);
          if (api_doc != pxVar26) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar17 = xmlMemBlocks();
          if (iVar14 != iVar17) {
            iVar17 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlReadDoc",(ulong)(uint)(iVar17 - iVar14));
            local_68 = local_68 + 1;
            printf(" %d",(ulong)uVar39);
            printf(" %d",uVar24);
            printf(" %d",(ulong)uVar51);
            printf(" %d");
            putchar(10);
          }
          uVar36 = uVar36 + 1;
          puVar54 = puVar54 + 1;
        } while (uVar36 != 5);
        uVar51 = uVar51 + 1;
      } while (uVar51 != 4);
      uVar51 = (uint)uVar24 + 1;
      uVar24 = (ulong)uVar51;
    } while (uVar51 != 8);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 5);
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar39 = 0;
  do {
    uVar24 = 0;
    do {
      uVar51 = 0;
      puVar54 = &DAT_00163444;
      do {
        iVar14 = xmlMemBlocks();
        if (uVar39 < 7) {
          uVar28 = (&DAT_00165d90)[uVar39];
        }
        else {
          uVar28 = 0;
        }
        if ((uint)uVar24 < 3) {
          uVar34 = (&DAT_00165d58)[uVar24];
        }
        else {
          uVar34 = 0;
        }
        uVar48 = 0x200;
        if (uVar51 < 4) {
          uVar48 = *puVar54;
        }
        pxVar26 = (xmlDocPtr)xmlReadFile(uVar28,uVar34,uVar48);
        if (api_doc != pxVar26) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar17 = xmlMemBlocks();
        if (iVar14 != iVar17) {
          iVar17 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlReadFile",(ulong)(uint)(iVar17 - iVar14));
          local_64 = local_64 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",uVar24);
          printf(" %d");
          putchar(10);
        }
        uVar51 = uVar51 + 1;
        puVar54 = puVar54 + 1;
      } while (uVar51 != 5);
      uVar51 = (uint)uVar24 + 1;
      uVar24 = (ulong)uVar51;
    } while (uVar51 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 8);
  function_tests = function_tests + 1;
  iVar14 = 0;
  iVar17 = 0;
  do {
    uVar24 = 0;
    do {
      uVar31 = 0;
      do {
        uVar39 = 0;
        do {
          uVar53 = 0;
          puVar54 = &DAT_00163444;
          do {
            iVar49 = xmlMemBlocks();
            if (iVar17 == 0) {
              bVar56 = false;
              pcVar41 = "foo";
            }
            else if (iVar17 == 2) {
              bVar56 = false;
              pcVar41 = "test/ent2";
            }
            else if (iVar17 == 1) {
              bVar56 = false;
              pcVar41 = "<foo/>";
            }
            else {
              bVar56 = true;
              pcVar41 = (char *)0x0;
            }
            iVar18 = -1;
            if ((uint)uVar24 < 4) {
              iVar18 = (&DAT_00163454)[uVar24];
            }
            if ((uint)uVar31 < 7) {
              uVar28 = (&DAT_00165d90)[uVar31];
            }
            else {
              uVar28 = 0;
            }
            if (uVar39 < 3) {
              uVar34 = (&DAT_00165d58)[uVar39];
            }
            else {
              uVar34 = 0;
            }
            uVar48 = 0x200;
            if ((uint)uVar53 < 4) {
              uVar48 = *puVar54;
            }
            if ((bVar56) || (sVar25 = strlen(pcVar41), iVar18 <= (int)sVar25 + 1)) {
              pxVar26 = (xmlDocPtr)xmlReadMemory(pcVar41,iVar18,uVar28,uVar34,uVar48);
              if (api_doc != pxVar26) {
                xmlFreeDoc();
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar18 = xmlMemBlocks();
              if (iVar49 != iVar18) {
                iVar18 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlReadMemory",(ulong)(uint)(iVar18 - iVar49));
                iVar14 = iVar14 + 1;
                printf(" %d",iVar17);
                printf(" %d",uVar24);
                printf(" %d",uVar31);
                printf(" %d",(ulong)uVar39);
                printf(" %d",uVar53);
                putchar(10);
              }
            }
            uVar51 = (uint)uVar53 + 1;
            uVar53 = (ulong)uVar51;
            puVar54 = puVar54 + 1;
          } while (uVar51 != 5);
          uVar39 = uVar39 + 1;
        } while (uVar39 != 4);
        uVar39 = (uint)uVar31 + 1;
        uVar31 = (ulong)uVar39;
      } while (uVar39 != 8);
      uVar39 = (uint)uVar24 + 1;
      uVar24 = (ulong)uVar39;
    } while (uVar39 != 4);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 4);
  function_tests = function_tests + 1;
  uVar39 = 0;
  iVar17 = 0;
  do {
    iVar49 = xmlMemBlocks();
    if (uVar39 < 4) {
      uVar28 = *local_50;
    }
    else {
      uVar28 = 0;
    }
    pxVar26 = (xmlDocPtr)xmlRecoverDoc(uVar28);
    if (api_doc != pxVar26) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar49 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRecoverDoc",(ulong)(uint)(iVar18 - iVar49));
      iVar17 = iVar17 + 1;
      printf(" %d",(ulong)uVar39);
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    local_50 = local_50 + 1;
  } while (uVar39 != 5);
  function_tests = function_tests + 1;
  uVar39 = 0;
  iVar49 = 0;
  do {
    iVar18 = xmlMemBlocks();
    if (uVar39 < 7) {
      uVar28 = *local_48;
    }
    else {
      uVar28 = 0;
    }
    pxVar26 = (xmlDocPtr)xmlRecoverFile(uVar28);
    if (api_doc != pxVar26) {
      xmlFreeDoc();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar18 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRecoverFile",(ulong)(uint)(iVar19 - iVar18));
      iVar49 = iVar49 + 1;
      printf(" %d",(ulong)uVar39);
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    local_48 = local_48 + 1;
  } while (uVar39 != 8);
  function_tests = function_tests + 1;
  iVar18 = 0;
  uVar39 = 0;
  do {
    piVar46 = &DAT_00163454;
    uVar24 = 0;
    do {
      iVar19 = xmlMemBlocks();
      if (uVar39 == 0) {
        bVar56 = false;
        pcVar41 = "foo";
      }
      else if (uVar39 == 2) {
        bVar56 = false;
        pcVar41 = "test/ent2";
      }
      else if (uVar39 == 1) {
        bVar56 = false;
        pcVar41 = "<foo/>";
      }
      else {
        bVar56 = true;
        pcVar41 = (char *)0x0;
      }
      iVar20 = -1;
      if ((uint)uVar24 < 4) {
        iVar20 = *piVar46;
      }
      if ((bVar56) || (sVar25 = strlen(pcVar41), iVar20 <= (int)sVar25 + 1)) {
        pxVar26 = (xmlDocPtr)xmlRecoverMemory(pcVar41,iVar20);
        if (api_doc != pxVar26) {
          xmlFreeDoc(pxVar26);
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar20 = xmlMemBlocks();
        if (iVar19 != iVar20) {
          iVar20 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlRecoverMemory",(ulong)(uint)(iVar20 - iVar19));
          iVar18 = iVar18 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",uVar24);
          putchar(10);
        }
      }
      uVar51 = (uint)uVar24 + 1;
      uVar24 = (ulong)uVar51;
      piVar46 = piVar46 + 1;
    } while (uVar51 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  local_88._0_4_ = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      uVar36 = 0;
      puVar44 = &DAT_00165d70;
      do {
        iVar19 = xmlMemBlocks();
        if (uVar39 == 0) {
          uVar28 = __xmlDefaultSAXHandler();
        }
        else {
          uVar28 = 0;
        }
        if (uVar51 < 4) {
          uVar34 = (&DAT_00165d70)[uVar51];
        }
        else {
          uVar34 = 0;
        }
        if (uVar36 < 4) {
          uVar35 = *puVar44;
        }
        else {
          uVar35 = 0;
        }
        pxVar27 = (xmlNodePtr)xmlSAXParseDTD(uVar28,uVar34,uVar35);
        desret_xmlNodePtr(pxVar27);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar20 = xmlMemBlocks();
        if (iVar19 != iVar20) {
          iVar20 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAXParseDTD",(ulong)(uint)(iVar20 - iVar19));
          local_88._0_4_ = (int)local_88 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          putchar(10);
        }
        uVar36 = uVar36 + 1;
        puVar44 = puVar44 + 1;
      } while (uVar36 != 5);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 5);
    bVar56 = uVar39 == 0;
    uVar39 = uVar39 + 1;
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar19 = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      uVar36 = 0;
      puVar54 = &DAT_00163454;
      do {
        iVar20 = xmlMemBlocks();
        if (uVar39 == 0) {
          uVar28 = __xmlDefaultSAXHandler();
        }
        else {
          uVar28 = 0;
        }
        if (uVar51 < 4) {
          uVar34 = (&DAT_00165d70)[uVar51];
        }
        else {
          uVar34 = 0;
        }
        uVar48 = 0xffffffff;
        if (uVar36 < 4) {
          uVar48 = *puVar54;
        }
        pxVar26 = (xmlDocPtr)xmlSAXParseDoc(uVar28,uVar34,uVar48);
        if (api_doc != pxVar26) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar21 = xmlMemBlocks();
        if (iVar20 != iVar21) {
          iVar21 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAXParseDoc",(ulong)(uint)(iVar21 - iVar20));
          iVar19 = iVar19 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          putchar(10);
        }
        uVar36 = uVar36 + 1;
        puVar54 = puVar54 + 1;
      } while (uVar36 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 5);
    bVar56 = uVar39 == 0;
    uVar39 = uVar39 + 1;
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar20 = 0;
  uVar39 = 0;
  do {
    puVar44 = &DAT_00165d90;
    uVar51 = 0;
    do {
      iVar21 = xmlMemBlocks();
      if (uVar39 == 0) {
        uVar28 = __xmlDefaultSAXHandler();
      }
      else {
        uVar28 = 0;
      }
      if (uVar51 < 7) {
        uVar34 = *puVar44;
      }
      else {
        uVar34 = 0;
      }
      pxVar26 = (xmlDocPtr)xmlSAXParseEntity(uVar28,uVar34);
      if (api_doc != pxVar26) {
        xmlFreeDoc();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar22 = xmlMemBlocks();
      if (iVar21 != iVar22) {
        iVar22 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSAXParseEntity",(ulong)(uint)(iVar22 - iVar21));
        iVar20 = iVar20 + 1;
        printf(" %d",(ulong)uVar39);
        printf(" %d");
        putchar(10);
      }
      uVar51 = uVar51 + 1;
      puVar44 = puVar44 + 1;
    } while (uVar51 != 8);
    bVar56 = uVar39 == 0;
    uVar39 = uVar39 + 1;
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar47 = iVar47 + iVar15 + iVar16 + iVar1 + iVar2 + iVar3 + (int)local_70 + iVar4 + (int)local_80
           + iVar5 + iVar6 + iVar8 + (uint)(iVar7 != iVar9) + (uint)(iVar10 != iVar11) + iVar12 +
           iVar13 + (int)local_90 + local_68 + local_64 + iVar14 + iVar17 + iVar49 + iVar18 +
           (int)local_88;
  local_70._0_4_ = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      uVar36 = 0;
      puVar54 = &DAT_00163454;
      do {
        iVar1 = xmlMemBlocks();
        if (uVar39 == 0) {
          uVar28 = __xmlDefaultSAXHandler();
        }
        else {
          uVar28 = 0;
        }
        if (uVar51 < 7) {
          uVar34 = (&DAT_00165d90)[uVar51];
        }
        else {
          uVar34 = 0;
        }
        uVar48 = 0xffffffff;
        if (uVar36 < 4) {
          uVar48 = *puVar54;
        }
        pxVar26 = (xmlDocPtr)xmlSAXParseFile(uVar28,uVar34,uVar48);
        if (api_doc != pxVar26) {
          xmlFreeDoc();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAXParseFile",(ulong)(uint)(iVar2 - iVar1));
          local_70._0_4_ = (int)local_70 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",(ulong)uVar51);
          printf(" %d");
          putchar(10);
        }
        uVar36 = uVar36 + 1;
        puVar54 = puVar54 + 1;
      } while (uVar36 != 4);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 8);
    bVar56 = uVar39 == 0;
    uVar39 = uVar39 + 1;
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar1 = 0;
  uVar24 = 0;
  do {
    uVar39 = 0;
    do {
      uVar31 = 0;
      do {
        iVar2 = 0;
        do {
          iVar3 = xmlMemBlocks();
          iVar4 = (int)uVar24;
          if (iVar4 == 0) {
            uVar28 = __xmlDefaultSAXHandler();
          }
          else {
            uVar28 = 0;
          }
          if (uVar39 < 7) {
            uVar34 = (&DAT_00165d90)[uVar39];
          }
          else {
            uVar34 = 0;
          }
          uVar48 = 0xffffffff;
          if ((uint)uVar31 < 4) {
            uVar48 = (&DAT_00163454)[uVar31];
          }
          piVar46 = &call_tests;
          if (iVar2 != 0) {
            if (iVar2 == 1) {
              piVar46 = (int *)0xffffffffffffffff;
            }
            else {
              piVar46 = (int *)0x0;
            }
          }
          pxVar26 = (xmlDocPtr)xmlSAXParseFileWithData(uVar28,uVar34,uVar48,piVar46);
          if (api_doc != pxVar26) {
            xmlFreeDoc();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar3 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAXParseFileWithData",(ulong)(uint)(iVar5 - iVar3)
                  );
            iVar1 = iVar1 + 1;
            printf(" %d",uVar24);
            printf(" %d",(ulong)uVar39);
            printf(" %d",uVar31);
            printf(" %d");
            putchar(10);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 != 3);
        uVar51 = (uint)uVar31 + 1;
        uVar31 = (ulong)uVar51;
      } while (uVar51 != 4);
      uVar39 = uVar39 + 1;
    } while (uVar39 != 8);
    uVar24 = (ulong)(iVar4 + 1);
  } while (iVar4 == 0);
  function_tests = function_tests + 1;
  local_68 = 0;
  local_80 = (undefined8 *)0x0;
  do {
    iVar2 = 0;
    do {
      uVar39 = 0;
      do {
        puVar54 = &DAT_00163454;
        uVar24 = 0;
        do {
          iVar3 = xmlMemBlocks();
          if ((int)local_80 == 0) {
            uVar28 = __xmlDefaultSAXHandler();
          }
          else {
            uVar28 = 0;
          }
          if (iVar2 == 0) {
            bVar56 = false;
            pcVar41 = "foo";
          }
          else if (iVar2 == 2) {
            bVar56 = false;
            pcVar41 = "test/ent2";
          }
          else if (iVar2 == 1) {
            bVar56 = false;
            pcVar41 = "<foo/>";
          }
          else {
            bVar56 = true;
            pcVar41 = (char *)0x0;
          }
          uVar48 = 0xffffffff;
          iVar4 = -1;
          if (uVar39 < 4) {
            iVar4 = (&DAT_00163454)[uVar39];
          }
          if ((uint)uVar24 < 4) {
            uVar48 = *puVar54;
          }
          if ((bVar56) || (sVar25 = strlen(pcVar41), iVar4 <= (int)sVar25 + 1)) {
            pxVar26 = (xmlDocPtr)xmlSAXParseMemory(uVar28,pcVar41,iVar4,uVar48);
            if (api_doc != pxVar26) {
              xmlFreeDoc(pxVar26);
            }
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar4 = xmlMemBlocks();
            if (iVar3 != iVar4) {
              iVar4 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSAXParseMemory",(ulong)(uint)(iVar4 - iVar3));
              local_68 = local_68 + 1;
              printf(" %d",local_80);
              printf(" %d",iVar2);
              printf(" %d",(ulong)uVar39);
              printf(" %d",uVar24);
              putchar(10);
            }
          }
          uVar51 = (uint)uVar24 + 1;
          uVar24 = (ulong)uVar51;
          puVar54 = puVar54 + 1;
        } while (uVar51 != 4);
        uVar39 = uVar39 + 1;
      } while (uVar39 != 4);
      iVar2 = iVar2 + 1;
    } while (iVar2 != 4);
    bVar56 = (int)local_80 == 0;
    local_80 = (undefined8 *)(ulong)((int)local_80 + 1);
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar2 = 0;
  local_80 = (undefined8 *)0x0;
  do {
    iVar3 = 0;
    do {
      uVar39 = 0;
      do {
        uVar24 = 0;
        do {
          uVar31 = 0;
          do {
            iVar4 = xmlMemBlocks();
            if ((int)local_80 == 0) {
              uVar28 = __xmlDefaultSAXHandler();
            }
            else {
              uVar28 = 0;
            }
            if (iVar3 == 0) {
              bVar56 = false;
              pcVar41 = "foo";
            }
            else if (iVar3 == 2) {
              bVar56 = false;
              pcVar41 = "test/ent2";
            }
            else if (iVar3 == 1) {
              bVar56 = false;
              pcVar41 = "<foo/>";
            }
            else {
              bVar56 = true;
              pcVar41 = (char *)0x0;
            }
            uVar48 = 0xffffffff;
            iVar5 = -1;
            if (uVar39 < 4) {
              iVar5 = (&DAT_00163454)[uVar39];
            }
            if ((uint)uVar24 < 4) {
              uVar48 = (&DAT_00163454)[uVar24];
            }
            piVar46 = &call_tests;
            iVar6 = (int)uVar31;
            if (iVar6 != 0) {
              if (iVar6 == 1) {
                piVar46 = (int *)0xffffffffffffffff;
              }
              else {
                piVar46 = (int *)0x0;
              }
            }
            if ((bVar56) || (sVar25 = strlen(pcVar41), iVar5 <= (int)sVar25 + 1)) {
              pxVar26 = (xmlDocPtr)xmlSAXParseMemoryWithData(uVar28,pcVar41,iVar5,uVar48,piVar46);
              if (api_doc != pxVar26) {
                xmlFreeDoc();
              }
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar4 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSAXParseMemoryWithData",
                       (ulong)(uint)(iVar5 - iVar4));
                iVar2 = iVar2 + 1;
                printf(" %d",local_80);
                printf(" %d",iVar3);
                printf(" %d",(ulong)uVar39);
                printf(" %d",uVar24);
                printf(" %d",uVar31);
                putchar(10);
              }
            }
            uVar31 = (ulong)(iVar6 + 1U);
          } while (iVar6 + 1U != 3);
          uVar51 = (uint)uVar24 + 1;
          uVar24 = (ulong)uVar51;
        } while (uVar51 != 4);
        uVar39 = uVar39 + 1;
      } while (uVar39 != 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != 4);
    bVar56 = (int)local_80 == 0;
    local_80 = (undefined8 *)(ulong)((int)local_80 + 1);
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar3 = 0;
  local_90 = 0;
  do {
    iVar4 = 0;
    do {
      uVar39 = 0;
      puVar44 = &DAT_00165d90;
      do {
        iVar5 = xmlMemBlocks();
        if ((int)local_90 == 0) {
          lVar30 = __xmlDefaultSAXHandler();
        }
        else {
          lVar30 = 0;
        }
        piVar46 = &call_tests;
        if (iVar4 != 0) {
          if (iVar4 == 1) {
            piVar46 = (int *)0xffffffffffffffff;
          }
          else {
            piVar46 = (int *)0x0;
          }
        }
        if (uVar39 < 7) {
          uVar28 = *puVar44;
        }
        else {
          uVar28 = 0;
        }
        lVar33 = __xmlDefaultSAXHandler();
        if (lVar30 == lVar33) {
          piVar46 = (int *)0x0;
        }
        xmlSAXUserParseFile(lVar30,piVar46,uVar28);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar5 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAXUserParseFile",(ulong)(uint)(iVar6 - iVar5));
          iVar3 = iVar3 + 1;
          printf(" %d",local_90);
          printf(" %d",iVar4);
          piVar46 = (int *)(ulong)uVar39;
          printf(" %d");
          putchar(10);
        }
        uVar39 = uVar39 + 1;
        puVar44 = puVar44 + 1;
      } while (uVar39 != 8);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
    bVar56 = (int)local_90 == 0;
    local_90 = (ulong)((int)local_90 + 1);
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar4 = 0;
  local_88 = (xmlParserInputBufferPtr)0x0;
  do {
    iVar5 = 0;
    do {
      iVar6 = 0;
      do {
        piVar38 = &DAT_00163454;
        piVar42 = (int *)0x0;
        do {
          iVar7 = xmlMemBlocks();
          if ((int)local_88 == 0) {
            lVar30 = __xmlDefaultSAXHandler();
          }
          else {
            lVar30 = 0;
          }
          piVar55 = &call_tests;
          if (iVar5 != 0) {
            if (iVar5 == 1) {
              piVar55 = (int *)0xffffffffffffffff;
            }
            else {
              piVar55 = (int *)0x0;
            }
          }
          if (iVar6 == 0) {
            bVar56 = false;
            pcVar41 = "foo";
          }
          else if (iVar6 == 2) {
            bVar56 = false;
            pcVar41 = "test/ent2";
          }
          else if (iVar6 == 1) {
            bVar56 = false;
            pcVar41 = "<foo/>";
          }
          else {
            bVar56 = true;
            pcVar41 = (char *)0x0;
          }
          iVar8 = -1;
          uVar39 = (uint)piVar42;
          if (uVar39 < 4) {
            iVar8 = *piVar38;
          }
          if ((bVar56) || (sVar25 = strlen(pcVar41), iVar8 <= (int)sVar25 + 1)) {
            lVar33 = __xmlDefaultSAXHandler();
            piVar46 = piVar55;
            if (lVar30 == lVar33) {
              piVar46 = (int *)0x0;
            }
            xmlSAXUserParseMemory(lVar30,piVar46,pcVar41,iVar8);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar7 != iVar8) {
              iVar8 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlSAXUserParseMemory",(ulong)(uint)(iVar8 - iVar7)
                    );
              iVar4 = iVar4 + 1;
              printf(" %d",local_88);
              printf(" %d",iVar5);
              printf(" %d",iVar6);
              printf(" %d");
              putchar(10);
              piVar46 = piVar42;
            }
          }
          uVar39 = uVar39 + 1;
          piVar42 = (int *)(ulong)uVar39;
          piVar38 = piVar38 + 1;
        } while (uVar39 != 4);
        iVar6 = iVar6 + 1;
      } while (iVar6 != 4);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    bVar56 = (int)local_88 == 0;
    local_88 = (xmlParserInputBufferPtr)(ulong)((int)local_88 + 1);
  } while (bVar56);
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      uVar36 = 0;
      do {
        iVar7 = (int)piVar46;
        iVar6 = xmlMemBlocks();
        pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar7);
        if (uVar51 < 3) {
          piVar46 = (int *)(&DAT_00165d58)[uVar51];
        }
        else {
          piVar46 = (int *)0x0;
        }
        xmlSetFeature(pxVar23,piVar46,0);
        call_tests = call_tests + 1;
        if (pxVar23 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar23);
        }
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar6 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSetFeature",(ulong)(uint)(iVar7 - iVar6));
          iVar5 = iVar5 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",(ulong)uVar51);
          piVar46 = (int *)(ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 == 1);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 4);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar39 = 0;
  do {
    uVar51 = 0;
    do {
      uVar36 = 0;
      puVar44 = &DAT_00165d90;
      do {
        iVar8 = (int)piVar46;
        iVar7 = xmlMemBlocks();
        pxVar23 = gen_xmlParserCtxtPtr(uVar39,iVar8);
        if (uVar51 < 4) {
          piVar46 = (int *)(&DAT_00165d70)[uVar51];
        }
        else {
          piVar46 = (int *)0x0;
        }
        if (uVar36 < 7) {
          uVar28 = *puVar44;
        }
        else {
          uVar28 = 0;
        }
        xmlSetupParserForBuffer(pxVar23,piVar46,uVar28);
        call_tests = call_tests + 1;
        if (pxVar23 != (xmlParserCtxtPtr)0x0) {
          xmlFreeParserCtxt(pxVar23);
        }
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSetupParserForBuffer",(ulong)(uint)(iVar8 - iVar7));
          iVar6 = iVar6 + 1;
          printf(" %d",(ulong)uVar39);
          printf(" %d",(ulong)uVar51);
          piVar46 = (int *)(ulong)uVar36;
          printf(" %d");
          putchar(10);
        }
        uVar36 = uVar36 + 1;
        puVar44 = puVar44 + 1;
      } while (uVar36 != 8);
      uVar51 = uVar51 + 1;
    } while (uVar51 != 5);
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  uVar39 = 0;
  iVar7 = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar23 = gen_xmlParserCtxtPtr(uVar39,(int)piVar46);
    xmlStopParser(pxVar23);
    call_tests = call_tests + 1;
    if (pxVar23 != (xmlParserCtxtPtr)0x0) {
      xmlFreeParserCtxt(pxVar23);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlStopParser",(ulong)(uint)(iVar9 - iVar8));
      iVar7 = iVar7 + 1;
      piVar46 = (int *)(ulong)uVar39;
      printf(" %d");
      putchar(10);
    }
    uVar39 = uVar39 + 1;
  } while (uVar39 != 3);
  function_tests = function_tests + 1;
  puVar54 = &DAT_00163454;
  uVar39 = 0;
  iVar8 = 0;
  do {
    iVar9 = xmlMemBlocks();
    uVar48 = 0xffffffff;
    if (uVar39 < 4) {
      uVar48 = *puVar54;
    }
    xmlSubstituteEntitiesDefault(uVar48);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSubstituteEntitiesDefault",(ulong)(uint)(iVar10 - iVar9)
            );
      iVar8 = iVar8 + 1;
      printf(" %d",(ulong)uVar39);
      putchar(10);
    }
    uVar39 = uVar39 + 1;
    puVar54 = puVar54 + 1;
  } while (uVar39 != 4);
  function_tests = function_tests + 1;
  uVar39 = iVar47 + iVar19 + iVar20 + (int)local_70 + iVar1 + local_68 + iVar2 + iVar3 + iVar4 +
           iVar5 + iVar6 + iVar7 + iVar8;
  if (uVar39 != 0) {
    printf("Module parser: %d errors\n",(ulong)uVar39);
  }
  return uVar39;
}

Assistant:

static int
test_parser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing parser : 61 of 70 functions ...\n");
    test_ret += test_xmlByteConsumed();
    test_ret += test_xmlClearNodeInfoSeq();
    test_ret += test_xmlClearParserCtxt();
    test_ret += test_xmlCreateDocParserCtxt();
    test_ret += test_xmlCreatePushParserCtxt();
    test_ret += test_xmlCtxtReadDoc();
    test_ret += test_xmlCtxtReadFile();
    test_ret += test_xmlCtxtReadMemory();
    test_ret += test_xmlCtxtReset();
    test_ret += test_xmlCtxtResetPush();
    test_ret += test_xmlCtxtUseOptions();
    test_ret += test_xmlGetExternalEntityLoader();
    test_ret += test_xmlGetFeature();
    test_ret += test_xmlGetFeaturesList();
    test_ret += test_xmlHasFeature();
    test_ret += test_xmlIOParseDTD();
    test_ret += test_xmlInitNodeInfoSeq();
    test_ret += test_xmlInitParser();
    test_ret += test_xmlInitParserCtxt();
    test_ret += test_xmlKeepBlanksDefault();
    test_ret += test_xmlLineNumbersDefault();
    test_ret += test_xmlLoadExternalEntity();
    test_ret += test_xmlNewIOInputStream();
    test_ret += test_xmlNewParserCtxt();
    test_ret += test_xmlParseBalancedChunkMemory();
    test_ret += test_xmlParseBalancedChunkMemoryRecover();
    test_ret += test_xmlParseChunk();
    test_ret += test_xmlParseCtxtExternalEntity();
    test_ret += test_xmlParseDTD();
    test_ret += test_xmlParseDoc();
    test_ret += test_xmlParseDocument();
    test_ret += test_xmlParseEntity();
    test_ret += test_xmlParseExtParsedEnt();
    test_ret += test_xmlParseExternalEntity();
    test_ret += test_xmlParseFile();
    test_ret += test_xmlParseInNodeContext();
    test_ret += test_xmlParseMemory();
    test_ret += test_xmlParserAddNodeInfo();
    test_ret += test_xmlParserFindNodeInfo();
    test_ret += test_xmlParserFindNodeInfoIndex();
    test_ret += test_xmlParserInputGrow();
    test_ret += test_xmlParserInputRead();
    test_ret += test_xmlPedanticParserDefault();
    test_ret += test_xmlReadDoc();
    test_ret += test_xmlReadFile();
    test_ret += test_xmlReadMemory();
    test_ret += test_xmlRecoverDoc();
    test_ret += test_xmlRecoverFile();
    test_ret += test_xmlRecoverMemory();
    test_ret += test_xmlSAXParseDTD();
    test_ret += test_xmlSAXParseDoc();
    test_ret += test_xmlSAXParseEntity();
    test_ret += test_xmlSAXParseFile();
    test_ret += test_xmlSAXParseFileWithData();
    test_ret += test_xmlSAXParseMemory();
    test_ret += test_xmlSAXParseMemoryWithData();
    test_ret += test_xmlSAXUserParseFile();
    test_ret += test_xmlSAXUserParseMemory();
    test_ret += test_xmlSetExternalEntityLoader();
    test_ret += test_xmlSetFeature();
    test_ret += test_xmlSetupParserForBuffer();
    test_ret += test_xmlStopParser();
    test_ret += test_xmlSubstituteEntitiesDefault();

    if (test_ret != 0)
	printf("Module parser: %d errors\n", test_ret);
    return(test_ret);
}